

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btKinematicCharacterController.cpp
# Opt level: O2

void __thiscall
btKinematicCharacterController::stepForwardAndStrafe
          (btKinematicCharacterController *this,btCollisionWorld *collisionWorld,btVector3 *walkMove
          )

{
  btVector3 *v1;
  btVector3 *v2;
  btBroadphaseProxy *pbVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  float extraout_XMM0_Da;
  btScalar tangentMag;
  btScalar bVar5;
  float fVar6;
  btVector3 bVar7;
  btVector3 currentDir;
  btTransform end;
  btTransform start;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  btVector3 local_78 [2];
  undefined8 local_58;
  btPairCachingGhostObject *local_50;
  btScalar local_48 [4];
  undefined4 local_38;
  
  v1 = &this->m_currentPosition;
  bVar7 = operator+(v1,walkMove);
  v2 = &this->m_targetPosition;
  *&(this->m_targetPosition).m_floats = bVar7.m_floats;
  start.m_basis.m_el[0].m_floats[0] = 1.0;
  start.m_basis.m_el[0].m_floats[1] = 0.0;
  start.m_basis.m_el[0].m_floats[2] = 0.0;
  start.m_basis.m_el[0].m_floats[3] = 0.0;
  start.m_basis.m_el[1].m_floats[0] = 0.0;
  start.m_basis.m_el[1].m_floats[1] = 1.0;
  start.m_basis.m_el[1].m_floats[2] = 0.0;
  start.m_basis.m_el[1].m_floats[3] = 0.0;
  start.m_basis.m_el[2].m_floats[0] = 0.0;
  start.m_basis.m_el[2].m_floats[1] = 0.0;
  start.m_basis.m_el[2].m_floats[2] = 1.0;
  start.m_basis.m_el[2].m_floats[3] = 0.0;
  end.m_basis.m_el[0].m_floats[0] = 1.0;
  end.m_basis.m_el[0].m_floats[1] = 0.0;
  end.m_basis.m_el[0].m_floats[2] = 0.0;
  end.m_basis.m_el[0].m_floats[3] = 0.0;
  end.m_basis.m_el[1].m_floats[0] = 0.0;
  end.m_basis.m_el[1].m_floats[1] = 1.0;
  end.m_basis.m_el[1].m_floats[2] = 0.0;
  end.m_basis.m_el[1].m_floats[3] = 0.0;
  end.m_basis.m_el[2].m_floats[0] = 0.0;
  end.m_basis.m_el[2].m_floats[1] = 0.0;
  end.m_basis.m_el[2].m_floats[2] = 1.0;
  end.m_basis.m_el[2].m_floats[3] = 0.0;
  local_a8 = (undefined1  [16])operator-(v1,v2);
  btVector3::length2((btVector3 *)local_a8);
  if (this->m_touchingContact == true) {
    btVector3::dot(&this->m_normalizedDirection,&this->m_touchingNormal);
  }
  fVar6 = 1.0;
  iVar4 = -10;
  do {
    if ((fVar6 <= 0.01) || (iVar4 == 0)) {
      return;
    }
    start.m_origin.m_floats._0_8_ = *(undefined8 *)v1->m_floats;
    start.m_origin.m_floats._8_8_ = *(undefined8 *)((this->m_currentPosition).m_floats + 2);
    end.m_origin.m_floats._0_8_ = *(undefined8 *)v2->m_floats;
    end.m_origin.m_floats._8_8_ = *(undefined8 *)((this->m_targetPosition).m_floats + 2);
    local_48 = (btScalar  [4])operator-(v1,v2);
    local_50 = this->m_ghostObject;
    local_a8._8_4_ = 0x3f800000;
    local_58 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_a8._0_8_ = &PTR__ConvexResultCallback_001f0eb8;
    local_38 = 0;
    pbVar1 = (local_50->super_btGhostObject).super_btCollisionObject.m_broadphaseHandle;
    local_a8._12_2_ = pbVar1->m_collisionFilterGroup;
    local_a8._14_2_ = pbVar1->m_collisionFilterMask;
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xc])();
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])
              (this->m_addedMargin + extraout_XMM0_Da);
    if (this->m_useGhostObjectSweepTest == true) {
      btGhostObject::convexSweepTest
                (&this->m_ghostObject->super_btGhostObject,this->m_convexShape,&start,&end,
                 (ConvexResultCallback *)local_a8,
                 (collisionWorld->m_dispatchInfo).m_allowedCcdPenetration);
    }
    else {
      btCollisionWorld::convexSweepTest
                (collisionWorld,this->m_convexShape,&start,&end,(ConvexResultCallback *)local_a8,
                 (collisionWorld->m_dispatchInfo).m_allowedCcdPenetration);
    }
    (*(this->m_convexShape->super_btCollisionShape)._vptr_btCollisionShape[0xb])(extraout_XMM0_Da);
    uVar3 = local_a8._8_4_;
    if (1.0 <= (float)local_a8._8_4_) {
      uVar2 = *(undefined8 *)((this->m_targetPosition).m_floats + 2);
      *(undefined8 *)v1->m_floats = *(undefined8 *)v2->m_floats;
      *(undefined8 *)((this->m_currentPosition).m_floats + 2) = uVar2;
    }
    else {
      updateTargetPositionBasedOnCollision(this,local_78,tangentMag,1.0);
      currentDir = operator-(v2,v1);
      bVar5 = btVector3::length2(&currentDir);
      if (bVar5 <= 1.1920929e-07) {
        return;
      }
      btVector3::normalize(&currentDir);
      if (currentDir.m_floats[2] * (this->m_normalizedDirection).m_floats[2] +
          currentDir.m_floats[0] * (this->m_normalizedDirection).m_floats[0] +
          currentDir.m_floats[1] * (this->m_normalizedDirection).m_floats[1] <= 0.0) {
        return;
      }
    }
    fVar6 = fVar6 - (float)uVar3;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void btKinematicCharacterController::stepForwardAndStrafe ( btCollisionWorld* collisionWorld, const btVector3& walkMove)
{
	// printf("m_normalizedDirection=%f,%f,%f\n",
	// 	m_normalizedDirection[0],m_normalizedDirection[1],m_normalizedDirection[2]);
	// phase 2: forward and strafe
	btTransform start, end;
	m_targetPosition = m_currentPosition + walkMove;

	start.setIdentity ();
	end.setIdentity ();

	btScalar fraction = 1.0;
	btScalar distance2 = (m_currentPosition-m_targetPosition).length2();
//	printf("distance2=%f\n",distance2);

	if (m_touchingContact)
	{
		if (m_normalizedDirection.dot(m_touchingNormal) > btScalar(0.0))
		{
			//interferes with step movement
			//updateTargetPositionBasedOnCollision (m_touchingNormal);
		}
	}

	int maxIter = 10;

	while (fraction > btScalar(0.01) && maxIter-- > 0)
	{
		start.setOrigin (m_currentPosition);
		end.setOrigin (m_targetPosition);
		btVector3 sweepDirNegative(m_currentPosition - m_targetPosition);

		btKinematicClosestNotMeConvexResultCallback callback (m_ghostObject, sweepDirNegative, btScalar(0.0));
		callback.m_collisionFilterGroup = getGhostObject()->getBroadphaseHandle()->m_collisionFilterGroup;
		callback.m_collisionFilterMask = getGhostObject()->getBroadphaseHandle()->m_collisionFilterMask;


		btScalar margin = m_convexShape->getMargin();
		m_convexShape->setMargin(margin + m_addedMargin);


		if (m_useGhostObjectSweepTest)
		{
			m_ghostObject->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		} else
		{
			collisionWorld->convexSweepTest (m_convexShape, start, end, callback, collisionWorld->getDispatchInfo().m_allowedCcdPenetration);
		}

		m_convexShape->setMargin(margin);


		fraction -= callback.m_closestHitFraction;

		if (callback.hasHit())
		{
			// we moved only a fraction
			//btScalar hitDistance;
			//hitDistance = (callback.m_hitPointWorld - m_currentPosition).length();

//			m_currentPosition.setInterpolate3 (m_currentPosition, m_targetPosition, callback.m_closestHitFraction);

			updateTargetPositionBasedOnCollision (callback.m_hitNormalWorld);
			btVector3 currentDir = m_targetPosition - m_currentPosition;
			distance2 = currentDir.length2();
			if (distance2 > SIMD_EPSILON)
			{
				currentDir.normalize();
				/* See Quake2: "If velocity is against original velocity, stop ead to avoid tiny oscilations in sloping corners." */
				if (currentDir.dot(m_normalizedDirection) <= btScalar(0.0))
				{
					break;
				}
			} else
			{
//				printf("currentDir: don't normalize a zero vector\n");
				break;
			}

		} else {
			// we moved whole way
			m_currentPosition = m_targetPosition;
		}

	//	if (callback.m_closestHitFraction == 0.f)
	//		break;

	}
}